

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void av1_change_config_seq(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf,_Bool *is_sb_size_changed)

{
  int *piVar1;
  _Bool _Var2;
  _Bool _Var3;
  BLOCK_SIZE BVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  aom_transfer_characteristics_t aVar11;
  BLOCK_SIZE BVar12;
  int i;
  int iVar13;
  long lVar14;
  int64_t iVar15;
  byte bVar16;
  byte bVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int64_t *piVar21;
  bool bVar22;
  bool bVar23;
  double display_sample_rate;
  double dVar24;
  double dVar25;
  
  if ((ppi->seq_params).profile != oxcf->profile) {
    (ppi->seq_params).profile = oxcf->profile;
  }
  (ppi->seq_params).bit_depth = (oxcf->tool_cfg).bit_depth;
  aVar11 = (oxcf->color_cfg).transfer_characteristics;
  (ppi->seq_params).color_primaries = (oxcf->color_cfg).color_primaries;
  (ppi->seq_params).transfer_characteristics = aVar11;
  (ppi->seq_params).matrix_coefficients = (oxcf->color_cfg).matrix_coefficients;
  (ppi->seq_params).monochrome = (oxcf->tool_cfg).enable_monochrome;
  (ppi->seq_params).chroma_sample_position = (oxcf->color_cfg).chroma_sample_position;
  (ppi->seq_params).color_range = (oxcf->color_cfg).color_range;
  _Var2 = (oxcf->dec_model_cfg).timing_info_present;
  (ppi->seq_params).timing_info_present = (uint)_Var2;
  uVar9 = (oxcf->dec_model_cfg).timing_info.time_scale;
  iVar13 = (oxcf->dec_model_cfg).timing_info.equal_picture_interval;
  uVar10 = (oxcf->dec_model_cfg).timing_info.num_ticks_per_picture;
  (ppi->seq_params).timing_info.num_units_in_display_tick =
       (oxcf->dec_model_cfg).timing_info.num_units_in_display_tick;
  (ppi->seq_params).timing_info.time_scale = uVar9;
  (ppi->seq_params).timing_info.equal_picture_interval = iVar13;
  (ppi->seq_params).timing_info.num_ticks_per_picture = uVar10;
  (ppi->seq_params).display_model_info_present_flag =
       (oxcf->dec_model_cfg).display_model_info_present_flag;
  _Var3 = (oxcf->dec_model_cfg).decoder_model_info_present_flag;
  (ppi->seq_params).decoder_model_info_present_flag = _Var3;
  if (_Var3 == true) {
    (ppi->seq_params).decoder_model_info.num_units_in_decoding_tick =
         (oxcf->dec_model_cfg).num_units_in_decoding_tick;
    ppi->buffer_removal_time_present = true;
    av1_set_aom_dec_model_info(&(ppi->seq_params).decoder_model_info);
    av1_set_dec_model_op_parameters((ppi->seq_params).op_params);
  }
  else if ((_Var2 == false) || (iVar13 == 0)) {
    (ppi->seq_params).op_params[0].initial_display_delay = 10;
  }
  else {
    av1_set_resource_availability_parameters((ppi->seq_params).op_params);
  }
  av1_update_film_grain_parameters_seq(ppi,oxcf);
  BVar4 = (ppi->seq_params).sb_size;
  if (ppi->seq_params_locked == 0) {
    BVar12 = av1_select_sb_size(oxcf,(oxcf->frm_dim_cfg).width,(oxcf->frm_dim_cfg).height,
                                ppi->number_spatial_layers);
    (ppi->seq_params).sb_size = BVar12;
    (ppi->seq_params).mib_size =
         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar12];
    (ppi->seq_params).mib_size_log2 = (uint)""[BVar12];
    lVar14 = 0;
    do {
      (ppi->seq_params).tier[lVar14] = (oxcf->tier_mask >> ((uint)lVar14 & 0x1f) & 1) != 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x20);
  }
  if ((is_sb_size_changed != (_Bool *)0x0) && (BVar4 != (ppi->seq_params).sb_size)) {
    *is_sb_size_changed = true;
  }
  if (ppi->seq_params_locked == 0) {
    if ((1 < ppi->number_spatial_layers) || (iVar13 = 0, 1 < ppi->number_temporal_layers)) {
      iVar13 = ppi->number_spatial_layers * ppi->number_temporal_layers + -1;
    }
    (ppi->seq_params).operating_points_cnt_minus_1 = iVar13;
    if (ppi->use_svc == 0) {
      bVar22 = (ppi->rtc_ref).set_ref_frame_config == 0;
    }
    else {
      bVar22 = false;
    }
    if ((oxcf->tool_cfg).force_video_mode == false) {
      bVar23 = (oxcf->input_cfg).limit == 1;
    }
    else {
      bVar23 = false;
    }
    (ppi->seq_params).still_picture = bVar23;
    if (bVar23 == false) {
      bVar16 = 0;
    }
    else {
      bVar16 = (oxcf->tool_cfg).full_still_picture_hdr ^ 1;
    }
    (ppi->seq_params).reduced_still_picture_hdr = bVar16;
    (ppi->seq_params).force_screen_content_tools = '\x02';
    (ppi->seq_params).force_integer_mv = '\x02';
    (ppi->seq_params).order_hint_info.enable_order_hint = (uint)(oxcf->tool_cfg).enable_order_hint;
    if (bVar16 == 0) {
      bVar23 = false;
      if (((oxcf->tile_cfg).enable_large_scale_tile == false) &&
         ((oxcf->tool_cfg).error_resilient_mode != false)) {
        bVar23 = bVar22;
      }
      (ppi->seq_params).frame_id_numbers_present_flag = bVar23;
    }
    else {
      (ppi->seq_params).frame_id_numbers_present_flag = '\0';
      (ppi->seq_params).order_hint_info.enable_order_hint = 0;
      (ppi->seq_params).force_screen_content_tools = '\x02';
      (ppi->seq_params).force_integer_mv = '\x02';
    }
    uVar6 = (ppi->seq_params).order_hint_info.enable_order_hint;
    (ppi->seq_params).order_hint_info.order_hint_bits_minus_1 = -(uint)(uVar6 == 0) | 6;
    iVar13 = (oxcf->frm_dim_cfg).forced_max_frame_width;
    if (iVar13 == 0) {
      iVar19 = (ppi->seq_params).max_frame_width;
      iVar13 = (oxcf->frm_dim_cfg).width;
      if (iVar13 < iVar19) {
        iVar13 = iVar19;
      }
    }
    (ppi->seq_params).max_frame_width = iVar13;
    iVar19 = (oxcf->frm_dim_cfg).forced_max_frame_height;
    if (iVar19 == 0) {
      iVar7 = (ppi->seq_params).max_frame_height;
      iVar19 = (oxcf->frm_dim_cfg).height;
      if (iVar19 < iVar7) {
        iVar19 = iVar7;
      }
    }
    uVar8 = 0x1f;
    if (iVar13 - 1U != 0) {
      for (; iVar13 - 1U >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    iVar7 = (uVar8 ^ 0xffffffe0) + 0x21;
    if (iVar13 < 2) {
      iVar7 = 1;
    }
    (ppi->seq_params).max_frame_height = iVar19;
    uVar8 = 0x1f;
    if (iVar19 - 1U != 0) {
      for (; iVar19 - 1U >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    iVar13 = (uVar8 ^ 0xffffffe0) + 0x21;
    if (iVar19 < 2) {
      iVar13 = 1;
    }
    (ppi->seq_params).num_bits_width = iVar7;
    (ppi->seq_params).num_bits_height = iVar13;
    (ppi->seq_params).frame_id_length = 0xf;
    (ppi->seq_params).delta_frame_id_length = 0xe;
    (ppi->seq_params).enable_dual_filter = (oxcf->tool_cfg).enable_dual_filter;
    (ppi->seq_params).order_hint_info.enable_dist_wtd_comp =
         (oxcf->comp_type_cfg).enable_dist_wtd_comp & uVar6;
    (ppi->seq_params).order_hint_info.enable_ref_frame_mvs =
         (oxcf->tool_cfg).ref_frame_mvs_present & uVar6;
    (ppi->seq_params).enable_superres = (oxcf->superres_cfg).enable_superres;
    (ppi->seq_params).enable_cdef = (oxcf->tool_cfg).cdef_control != CDEF_NONE;
    (ppi->seq_params).enable_restoration = (oxcf->tool_cfg).enable_restoration;
    (ppi->seq_params).enable_warped_motion = (oxcf->motion_mode_cfg).enable_warped_motion;
    (ppi->seq_params).enable_interintra_compound = (oxcf->tool_cfg).enable_interintra_comp;
    (ppi->seq_params).enable_masked_compound = (oxcf->comp_type_cfg).enable_masked_comp;
    (ppi->seq_params).enable_intra_edge_filter = (oxcf->intra_mode_cfg).enable_intra_edge_filter;
    (ppi->seq_params).enable_filter_intra = (oxcf->intra_mode_cfg).enable_filter_intra;
    iVar13 = (oxcf->frm_dim_cfg).width;
    iVar19 = (oxcf->frm_dim_cfg).height;
    dVar24 = (oxcf->input_cfg).init_framerate;
    lVar14 = (long)iVar19 * (long)iVar13;
    if (((((((0x24000 < lVar14) || (0x480 < iVar19)) || (0x800 < iVar13)) ||
          (bVar16 = 0, 4423680.0 < (double)lVar14 * dVar24)) &&
         ((((0x44100 < lVar14 || (0x630 < iVar19)) ||
           ((0xb00 < iVar13 || (bVar16 = 1, 8363520.0 < (double)lVar14 * dVar24)))) &&
          (((0xa2900 < lVar14 || (0x990 < iVar19)) ||
           ((0x1100 < iVar13 || (bVar16 = 4, 19975680.0 < (double)lVar14 * dVar24)))))))) &&
        ((((0x104040 < lVar14 || (0xc18 < iVar19)) || (0x1580 < iVar13)) ||
         (bVar16 = 5, 31950720.0 < (double)lVar14 * dVar24)))) &&
       (((0x240000 < lVar14 ||
         ((((0xd80 < iVar19 || (0x1800 < iVar13)) ||
           (bVar16 = 8, 70778880.0 < (double)lVar14 * dVar24)) &&
          (((0xd80 < iVar19 || (0x1800 < iVar13)) ||
           (bVar16 = 9, 141557760.0 < (double)lVar14 * dVar24)))))) &&
        (((0x880000 < lVar14 ||
          (((((dVar25 = (double)lVar14 * dVar24, 0x1100 < iVar19 || (0x2000 < iVar13)) ||
             (bVar16 = 0xc, 267386880.0 < dVar25)) &&
            (((0x1100 < iVar19 || (0x2000 < iVar13)) || (bVar16 = 0xd, 534773760.0 < dVar25)))) &&
           (((0x1100 < iVar19 || (0x2000 < iVar13)) || (bVar16 = 0xe, 1069547520.0 < dVar25)))))) &&
         (bVar16 = 0x1f, lVar14 < 0x2200001)))))) {
      dVar24 = dVar24 * (double)lVar14;
      bVar16 = 0x10;
      if ((0x2200 < iVar19 || 0x4000 < iVar13) || 1069547520.0 < dVar24) {
        bVar16 = 0x1f;
        if ((iVar13 < 0x4001 && iVar19 < 0x2201) && 2139095040.0 >= dVar24) {
          bVar16 = 0x11;
        }
        if (((((iVar13 >= 0x4001 || iVar19 >= 0x2201) || 2139095040.0 < dVar24) &&
             (bVar16 = 0x1f, iVar13 < 0x4001)) && (dVar24 <= 4278190080.0)) &&
           (bVar16 = 0x12, 0x2200 < iVar19)) {
          bVar16 = 0x1f;
        }
      }
    }
    piVar21 = &(ppi->seq_params).op_params[0].bitrate;
    lVar14 = 0xc0f9;
    do {
      bVar5 = *(byte *)((long)ppi + lVar14 + -0x6669);
      bVar17 = bVar16;
      if (bVar16 < bVar5) {
        bVar17 = bVar5;
      }
      if (0x1b < bVar5) {
        bVar17 = bVar16;
      }
      *(byte *)((long)ppi->parallel_cpi + lVar14 + -0x20) = bVar17;
      iVar15 = av1_max_level_bitrate
                         ((ppi->seq_params).profile,(uint)bVar17,
                          (uint)*(byte *)((long)ppi->parallel_cpi + lVar14));
      *piVar21 = iVar15;
      if (iVar15 == 0) {
        aom_internal_error(&ppi->error,AOM_CODEC_UNSUP_BITSTREAM,
                           "AV1 does not support this combination of profile, level, and tier.");
      }
      piVar21[1] = *piVar21;
      lVar14 = lVar14 + 1;
      piVar21 = piVar21 + 6;
    } while (lVar14 != 0xc119);
    av1_set_svc_seq_params(ppi);
  }
  piVar1 = &(ppi->seq_params).timing_info_present;
  *piVar1 = *piVar1 & (uint)((ppi->seq_params).reduced_still_picture_hdr == '\0');
  highbd_set_var_fns(ppi);
  lVar14 = (oxcf->rc_cfg).target_bandwidth;
  lVar20 = (oxcf->rc_cfg).optimal_buffer_level_ms;
  lVar18 = (oxcf->rc_cfg).maximum_buffer_size_ms;
  (ppi->p_rc).starting_buffer_level = ((oxcf->rc_cfg).starting_buffer_level_ms * lVar14) / 1000;
  if (lVar20 == 0) {
    lVar20 = lVar14 + 7;
    if (-1 < lVar14) {
      lVar20 = lVar14;
    }
    lVar20 = lVar20 >> 3;
  }
  else {
    lVar20 = (lVar20 * lVar14) / 1000;
  }
  (ppi->p_rc).optimal_buffer_level = lVar20;
  if (lVar18 == 0) {
    lVar20 = lVar14 + 7;
    if (-1 < lVar14) {
      lVar20 = lVar14;
    }
    lVar20 = lVar20 >> 3;
  }
  else {
    lVar20 = (lVar18 * lVar14) / 1000;
  }
  (ppi->p_rc).maximum_buffer_size = lVar20;
  lVar14 = (ppi->p_rc).buffer_level;
  lVar18 = (ppi->p_rc).bits_off_target;
  if (lVar20 <= lVar18) {
    lVar18 = lVar20;
  }
  (ppi->p_rc).bits_off_target = lVar18;
  if (lVar14 < lVar20) {
    lVar20 = lVar14;
  }
  (ppi->p_rc).buffer_level = lVar20;
  return;
}

Assistant:

void av1_change_config_seq(struct AV1_PRIMARY *ppi,
                           const AV1EncoderConfig *oxcf,
                           bool *is_sb_size_changed) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  const FrameDimensionCfg *const frm_dim_cfg = &oxcf->frm_dim_cfg;
  const DecoderModelCfg *const dec_model_cfg = &oxcf->dec_model_cfg;
  const ColorCfg *const color_cfg = &oxcf->color_cfg;

  if (seq_params->profile != oxcf->profile) seq_params->profile = oxcf->profile;
  seq_params->bit_depth = oxcf->tool_cfg.bit_depth;
  seq_params->color_primaries = color_cfg->color_primaries;
  seq_params->transfer_characteristics = color_cfg->transfer_characteristics;
  seq_params->matrix_coefficients = color_cfg->matrix_coefficients;
  seq_params->monochrome = oxcf->tool_cfg.enable_monochrome;
  seq_params->chroma_sample_position = color_cfg->chroma_sample_position;
  seq_params->color_range = color_cfg->color_range;

  assert(IMPLIES(seq_params->profile <= PROFILE_1,
                 seq_params->bit_depth <= AOM_BITS_10));

  seq_params->timing_info_present = dec_model_cfg->timing_info_present;
  seq_params->timing_info.num_units_in_display_tick =
      dec_model_cfg->timing_info.num_units_in_display_tick;
  seq_params->timing_info.time_scale = dec_model_cfg->timing_info.time_scale;
  seq_params->timing_info.equal_picture_interval =
      dec_model_cfg->timing_info.equal_picture_interval;
  seq_params->timing_info.num_ticks_per_picture =
      dec_model_cfg->timing_info.num_ticks_per_picture;

  seq_params->display_model_info_present_flag =
      dec_model_cfg->display_model_info_present_flag;
  seq_params->decoder_model_info_present_flag =
      dec_model_cfg->decoder_model_info_present_flag;
  if (dec_model_cfg->decoder_model_info_present_flag) {
    // set the decoder model parameters in schedule mode
    seq_params->decoder_model_info.num_units_in_decoding_tick =
        dec_model_cfg->num_units_in_decoding_tick;
    ppi->buffer_removal_time_present = 1;
    av1_set_aom_dec_model_info(&seq_params->decoder_model_info);
    av1_set_dec_model_op_parameters(&seq_params->op_params[0]);
  } else if (seq_params->timing_info_present &&
             seq_params->timing_info.equal_picture_interval &&
             !seq_params->decoder_model_info_present_flag) {
    // set the decoder model parameters in resource availability mode
    av1_set_resource_availability_parameters(&seq_params->op_params[0]);
  } else {
    seq_params->op_params[0].initial_display_delay =
        10;  // Default value (not signaled)
  }

#if !CONFIG_REALTIME_ONLY
  av1_update_film_grain_parameters_seq(ppi, oxcf);
#endif

  int sb_size = seq_params->sb_size;
  // Superblock size should not be updated after the first key frame.
  if (!ppi->seq_params_locked) {
    set_sb_size(seq_params, av1_select_sb_size(oxcf, frm_dim_cfg->width,
                                               frm_dim_cfg->height,
                                               ppi->number_spatial_layers));
    for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i)
      seq_params->tier[i] = (oxcf->tier_mask >> i) & 1;
  }
  if (is_sb_size_changed != NULL && sb_size != seq_params->sb_size)
    *is_sb_size_changed = true;

  // Init sequence level coding tools
  // This should not be called after the first key frame.
  // Note that for SVC encoding the sequence parameters
  // (operating_points_cnt_minus_1, operating_point_idc[],
  // has_nonzero_operating_point_idc) should be updated whenever the
  // number of layers is changed. This is done in the
  // ctrl_set_svc_params().
  if (!ppi->seq_params_locked) {
    seq_params->operating_points_cnt_minus_1 =
        (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1)
            ? ppi->number_spatial_layers * ppi->number_temporal_layers - 1
            : 0;
    init_seq_coding_tools(ppi, oxcf,
                          ppi->use_svc || ppi->rtc_ref.set_ref_frame_config);
  }
  seq_params->timing_info_present &= !seq_params->reduced_still_picture_hdr;

#if CONFIG_AV1_HIGHBITDEPTH
  highbd_set_var_fns(ppi);
#endif

  set_primary_rc_buffer_sizes(oxcf, ppi);
}